

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullStore.cpp
# Opt level: O2

MessageStore * __thiscall
FIX::NullStoreFactory::create(NullStoreFactory *this,UtcTimeStamp *now,SessionID *param_2)

{
  _func_int **pp_Var1;
  MessageStore *pMVar2;
  
  pMVar2 = (MessageStore *)operator_new(0x30);
  pMVar2->_vptr_MessageStore = (_func_int **)&PTR__NullStore_001fd7b0;
  pMVar2[1]._vptr_MessageStore = (_func_int **)0x1;
  pMVar2[2]._vptr_MessageStore = (_func_int **)0x1;
  pp_Var1 = (_func_int **)(now->super_DateTime).m_time;
  pMVar2[4]._vptr_MessageStore = *(_func_int ***)&(now->super_DateTime).m_date;
  pMVar2[5]._vptr_MessageStore = pp_Var1;
  pMVar2[3]._vptr_MessageStore = (_func_int **)&PTR__DateTime_001fca38;
  return pMVar2;
}

Assistant:

MessageStore *NullStoreFactory::create(const UtcTimeStamp &now, const SessionID &) { return new NullStore(now); }